

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O0

bool DiffDistTest2<unsigned_long,unsigned_int>(pfHash hash,bool drawDiagram)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  byte in_SIL;
  code *in_RDI;
  int i;
  int keybit;
  bool result;
  uint h2;
  uint h1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> hashes;
  unsigned_long k;
  int keycount;
  int keybits;
  Rand r;
  uint32_t in_stack_ffffffffffffff7c;
  undefined2 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff82;
  byte bVar4;
  undefined1 in_stack_ffffffffffffff83;
  undefined4 in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint bit;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 uVar5;
  uint in_stack_ffffffffffffff9c;
  uint in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  undefined1 local_30 [12];
  undefined4 local_24;
  int local_20;
  byte local_9;
  code *local_8;
  
  local_9 = in_SIL & 1;
  local_8 = in_RDI;
  Rand::Rand((Rand *)CONCAT44(in_stack_ffffffffffffff84,
                              CONCAT13(in_stack_ffffffffffffff83,
                                       CONCAT12(in_stack_ffffffffffffff82,in_stack_ffffffffffffff80)
                                      )),in_stack_ffffffffffffff7c);
  local_20 = 0x40;
  local_24 = 0x200000;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x12df06);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x12df26);
  uVar5 = CONCAT13(1,(int3)in_stack_ffffffffffffff98);
  for (bit = 0; (int)bit < local_20; bit = bit + 1) {
    printf("Testing bit %d\n",(ulong)bit);
    for (in_stack_ffffffffffffff90 = 0; in_stack_ffffffffffffff90 < 0x200000;
        in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 + 1) {
      Rand::rand_p((Rand *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (void *)CONCAT44(in_stack_ffffffffffffff9c,uVar5),bit);
      (*local_8)(local_30,8,0,&stack0xffffffffffffffa0);
      flipbit(local_30,8,bit);
      (*local_8)(local_30,8,0,&stack0xffffffffffffff9c);
      uVar2 = in_stack_ffffffffffffffa0 ^ in_stack_ffffffffffffff9c;
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_48,(long)in_stack_ffffffffffffff90);
      *pvVar3 = uVar2;
    }
    bVar1 = TestHashList<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)r._4_8_,r.x._3_1_,
                       r.x._2_1_,r.x._1_1_,r.x._0_1_,keybits._3_1_);
    uVar5 = CONCAT13(bVar1 & (byte)((uint)uVar5 >> 0x18),(int3)uVar5);
    printf("\n");
  }
  bVar4 = (byte)((uint)uVar5 >> 0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(bit,in_stack_ffffffffffffff90));
  return (bool)(bVar4 & 1);
}

Assistant:

bool DiffDistTest2 ( pfHash hash, bool drawDiagram )
{
  Rand r(857374);

  int keybits = sizeof(keytype) * 8;
  const int keycount = 256*256*32;
  keytype k;
  
  std::vector<hashtype> hashes(keycount);
  hashtype h1,h2;

  bool result = true;

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    printf("Testing bit %d\n",keybit);

    for(int i = 0; i < keycount; i++)
    {
      r.rand_p(&k,sizeof(keytype));
      
      hash(&k,sizeof(keytype),0,&h1);
      flipbit(&k,sizeof(keytype),keybit);
      hash(&k,sizeof(keytype),0,&h2);

      hashes[i] = h1 ^ h2;
    }

    result &= TestHashList<hashtype>(hashes,true,true,drawDiagram);
    printf("\n");
  }

  return result;
}